

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

Position aiBegin(char (*board) [15],int me)

{
  Position PVar1;
  int local_24;
  int local_20;
  int j;
  int i;
  int me_local;
  char (*board_local) [15];
  Position preferedPos;
  
  memset(&board_local,0,8);
  local_20 = 0;
  do {
    if (0xe < local_20) {
LAB_00101260:
      PVar1.y = board_local._4_4_;
      PVar1.x = (int)board_local;
      return PVar1;
    }
    for (local_24 = 0; local_24 < 0xf; local_24 = local_24 + 1) {
      if (board[local_20][local_24] == '\0') {
        board_local._0_4_ = local_20;
        board_local._4_4_ = local_24;
        goto LAB_00101260;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

struct Position aiBegin(const char board[BOARD_SIZE][BOARD_SIZE], int me) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。 
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。 
     */
    int i, j;
    struct Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}